

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O2

void * hash_table_get(HashTable *hash_table,char *key)

{
  int iVar1;
  unsigned_long uVar2;
  HashTableEntry *pHVar3;
  
  uVar2 = hash(hash_table->size,key);
  pHVar3 = hash_table->table[uVar2];
  if (pHVar3 != (HashTableEntry *)0x0) {
    for (; pHVar3 != (HashTableEntry *)0x0; pHVar3 = pHVar3->next) {
      iVar1 = strcmp(key,pHVar3->key);
      if (iVar1 < 1) {
        if (iVar1 != 0) {
          return (void *)0x0;
        }
        return pHVar3->literal;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *hash_table_get(HashTable *hash_table, char *key) {
  unsigned long int hash_literal = hash(hash_table->size, key);

  HashTableEntry *next = hash_table->table[hash_literal];

  if (next != NULL) {
    HashTableEntry *last;

    while (next != NULL && strcmp(key, next->key) > 0) {
      last = next;
      next = last->next;
    }

    if (next != NULL && strcmp(key, next->key) == 0) {
      return next->literal;
    }
  }

  return NULL;
}